

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

void __thiscall
embree::SceneGraph::MultiTransformNode::MultiTransformNode
          (MultiTransformNode *this,
          vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
          *spaces,Ref<embree::SceneGraph::Node> *child)

{
  Node *pNVar1;
  
  Node::Node(&this->super_Node,false);
  (this->super_Node).super_RefCount._vptr_RefCount = (_func_int **)&PTR__MultiTransformNode_002a95a8
  ;
  std::
  vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
  ::vector(&this->spaces,spaces);
  pNVar1 = child->ptr;
  (this->child).ptr = pNVar1;
  if (pNVar1 != (Node *)0x0) {
    (*(pNVar1->super_RefCount)._vptr_RefCount[2])();
  }
  return;
}

Assistant:

MultiTransformNode(const std::vector<Transformations>& spaces, const Ref<Node>& child)
        : spaces(spaces), child(child) {}